

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O2

void encode_block_inter(int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,
                       TX_SIZE tx_size,void *arg,RUN_TYPE dry_run)

{
  MACROBLOCKD *xd;
  char cVar1;
  byte tx_size_00;
  ushort uVar2;
  MACROBLOCK *x;
  MB_MODE_INFO *pMVar3;
  long lVar4;
  BLOCK_SIZE tx_type;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int col;
  uint __c;
  int iVar9;
  ulong uVar10;
  macroblock_plane *pmVar11;
  int iVar12;
  bool bVar13;
  int local_110;
  int dummy_rate_cost;
  long local_b8;
  ENTROPY_CONTEXT *local_b0;
  ENTROPY_CONTEXT *local_a8;
  ulong local_a0;
  macroblock_plane *local_98;
  uint8_t *local_90;
  tran_low_t *local_88;
  macroblockd_plane *local_80;
  TXB_CTX local_78;
  TxfmParam txfm_param;
  QUANT_PARAM quant_param;
  
  x = *(MACROBLOCK **)((long)arg + 8);
  xd = &x->e_mbd;
  pMVar3 = *(x->e_mbd).mi;
  iVar5 = max_block_high(xd,plane_bsize,plane);
  iVar6 = max_block_wide(xd,plane_bsize,plane);
  iVar12 = iVar5 - blk_row;
  iVar7 = iVar6 - blk_col;
  if ((iVar7 == 0 || iVar6 < blk_col) || (iVar12 == 0 || iVar5 < blk_row)) {
    return;
  }
  uVar10 = (ulong)plane_bsize;
  if ((plane == 0) &&
     (pMVar3->inter_tx_size
      [(blk_col >> (av1_get_txb_size_index_tw_w_log2_table[uVar10] & 0x1f)) +
       ((blk_row >> (av1_get_txb_size_index_tw_h_log2_table[uVar10] & 0x1f)) <<
       (av1_get_txb_size_index_stride_log2_table[uVar10] & 0x1f))] != tx_size)) {
    tx_size_00 = ""[(uint)tx_size];
    iVar5 = tx_size_wide_unit[tx_size_00];
    iVar6 = tx_size_high_unit[tx_size_00];
    if (tx_size_high_unit[tx_size] < iVar12) {
      iVar12 = tx_size_high_unit[tx_size];
    }
    if (tx_size_wide_unit[tx_size] < iVar7) {
      iVar7 = tx_size_wide_unit[tx_size];
    }
    local_110 = block;
    for (iVar8 = 0; iVar8 < iVar12; iVar8 = iVar8 + iVar6) {
      for (iVar9 = 0; iVar9 < iVar7; iVar9 = iVar9 + iVar5) {
        encode_block_inter(0,local_110,iVar8 + blk_row,blk_col + iVar9,plane_bsize,tx_size_00,arg,
                           dry_run);
        local_110 = local_110 + iVar6 * iVar5;
      }
    }
    return;
  }
  local_80 = (x->e_mbd).plane + plane;
  lVar4 = *arg;
  pmVar11 = x->plane + plane;
  local_88 = x->plane[plane].dqcoeff + (block << 4);
  dummy_rate_cost = 0;
  local_90 = (x->e_mbd).plane[plane].dst.buf +
             ((x->e_mbd).plane[plane].dst.stride * blk_row + blk_col) * 4;
  local_b0 = (ENTROPY_CONTEXT *)((long)blk_col + *(long *)((long)arg + 0x18));
  local_a8 = (ENTROPY_CONTEXT *)((long)blk_row + *(long *)((long)arg + 0x20));
  local_b8 = lVar4;
  if ((((x->txfm_search_info).blk_skip
        [(int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [uVar10] * blk_row + blk_col)] >> (plane & 0x1fU) & 1) == 0) &&
     ((pMVar3->field_0xa7 & 0x40) == 0)) {
    local_a0 = uVar10;
    local_98 = pmVar11;
    tx_type = av1_get_tx_type(xd,local_80->plane_type,blk_row,blk_col,tx_size,
                              (uint)*(byte *)(lVar4 + 0x3c175));
    cVar1 = *(char *)((long)arg + 0x29);
    av1_setup_xform((AV1_COMMON *)(lVar4 + 0x3bf80),x,tx_size,tx_type,&txfm_param);
    iVar7 = *(int *)(lVar4 + 0x423fc);
    quant_param.log_scale = av1_get_tx_scale(tx_size);
    uVar10 = local_a0;
    quant_param.qmatrix = (qm_val_t *)0x0;
    quant_param.iqmatrix = (qm_val_t *)0x0;
    quant_param.tx_size = tx_size;
    quant_param.use_quant_b_adapt = iVar7;
    quant_param.use_optimize_b = (uint)((dry_run == '\0' || cVar1 != '\x02') && cVar1 != '\0');
    quant_param.xform_quant_idx = (uint)(dry_run != '\0' && cVar1 == '\x02' || cVar1 == '\0');
    av1_setup_qmatrix((CommonQuantParams *)(lVar4 + 0x3c1e8),xd,plane,tx_size,tx_type,&quant_param);
    av1_xform_quant(x,plane,block,blk_row,blk_col,(BLOCK_SIZE)uVar10,&txfm_param,&quant_param);
    if (quant_param.use_optimize_b != 0) {
      get_txb_ctx((BLOCK_SIZE)uVar10,tx_size,plane,local_b0,local_a8,&local_78);
      plane_bsize = tx_size;
      av1_optimize_b(*arg,x,plane,block,tx_size,tx_type,&local_78,&dummy_rate_cost);
      pmVar11 = local_98;
      if (quant_param.use_optimize_b != 0) goto LAB_00199664;
    }
    plane_bsize = tx_type;
    av1_dropout_qcoeff(x,plane,block,tx_size,tx_type,
                       ((CommonQuantParams *)(lVar4 + 0x3c1e8))->base_qindex);
    pmVar11 = local_98;
  }
  else {
    pmVar11->eobs[block] = 0;
    pmVar11->txb_entropy_ctx[block] = '\0';
    tx_type = BLOCK_4X4;
  }
LAB_00199664:
  uVar10 = (ulong)((uint)tx_size * 4);
  __c = (uint)x->plane[plane].txb_entropy_ctx[block];
  memset(local_b0,__c,(long)*(int *)((long)tx_size_wide_unit + uVar10));
  memset(local_a8,__c,(long)*(int *)((long)tx_size_high_unit + uVar10));
  uVar2 = pmVar11->eobs[block];
  if (uVar2 == 0) {
    pMVar3->skip_txfm = pMVar3->skip_txfm & 1;
    bVar13 = true;
  }
  else {
    pMVar3->skip_txfm = '\0';
    plane_bsize = tx_size;
    av1_inverse_transform_block
              (xd,local_88,plane,tx_type,tx_size,local_90,(local_80->dst).stride,(uint)uVar2,
               (uint)*(byte *)(local_b8 + 0x3c175));
    bVar13 = pmVar11->eobs[block] == 0;
  }
  if ((plane == 0) && (bVar13)) {
    update_txk_array(xd,blk_row,blk_col,tx_size,plane_bsize);
  }
  return;
}

Assistant:

static void encode_block_inter(int plane, int block, int blk_row, int blk_col,
                               BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                               void *arg, RUN_TYPE dry_run) {
  struct encode_b_args *const args = arg;
  MACROBLOCK *const x = args->x;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  const TX_SIZE plane_tx_size =
      plane ? av1_get_max_uv_txsize(mbmi->bsize, pd->subsampling_x,
                                    pd->subsampling_y)
            : mbmi->inter_tx_size[av1_get_txb_size_index(plane_bsize, blk_row,
                                                         blk_col)];
  if (!plane) {
    assert(tx_size_wide[tx_size] >= tx_size_wide[plane_tx_size] &&
           tx_size_high[tx_size] >= tx_size_high[plane_tx_size]);
  }

  if (tx_size == plane_tx_size || plane) {
    encode_block(plane, block, blk_row, blk_col, plane_bsize, tx_size, arg,
                 dry_run);
  } else {
    assert(tx_size < TX_SIZES_ALL);
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    assert(IMPLIES(tx_size <= TX_4X4, sub_txs == tx_size));
    assert(IMPLIES(tx_size > TX_4X4, sub_txs < tx_size));
    // This is the square transform block partition entry point.
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];
    const int step = bsh * bsw;
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);
    assert(bsw > 0 && bsh > 0);

    for (int row = 0; row < row_end; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += bsw) {
        const int offsetc = blk_col + col;

        encode_block_inter(plane, block, offsetr, offsetc, plane_bsize, sub_txs,
                           arg, dry_run);
        block += step;
      }
    }
  }
}